

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  int *piVar1;
  byte bVar2;
  Btree *p;
  BtShared *pBVar3;
  Pager *pPVar4;
  sqlite3 *db_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  _func_int_void_ptr *xBusy;
  int iVar8;
  long lVar9;
  Wal *pWal;
  void *pBusyArg;
  long lVar10;
  
  iVar7 = db->nDb;
  if (iVar7 < 1) {
    return 0;
  }
  lVar9 = 0;
  bVar6 = false;
  lVar10 = 1;
  do {
    if (iDb == 0xc || (ulong)(uint)iDb << 5 == lVar9) {
      p = *(Btree **)((long)&db->aDb->pBt + lVar9);
      if (p == (Btree *)0x0) {
        iVar7 = 0;
      }
      else {
        pBVar3 = p->pBt;
        if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
          btreeLockCarefully(p);
        }
        iVar7 = 6;
        if (pBVar3->inTransaction == '\0') {
          pPVar4 = pBVar3->pPager;
          db_00 = p->db;
          pWal = pPVar4->pWal;
          if (pWal == (Wal *)0x0) {
            iVar7 = 0;
            if (pPVar4->journalMode == '\x05') {
              iVar7 = 0;
              sqlite3_exec(db_00,"PRAGMA table_list",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0)
              ;
              pWal = pPVar4->pWal;
              if (pWal != (Wal *)0x0) goto LAB_00125600;
            }
          }
          else {
LAB_00125600:
            if (eMode == 0) {
              pBusyArg = pPVar4->pBusyHandlerArg;
              bVar2 = pPVar4->walSyncFlags;
              iVar7 = (int)pPVar4->pageSize;
              iVar8 = 0;
              xBusy = (_func_int_void_ptr *)0x0;
            }
            else {
              xBusy = pPVar4->xBusyHandler;
              pBusyArg = pPVar4->pBusyHandlerArg;
              bVar2 = pPVar4->walSyncFlags;
              iVar7 = (int)pPVar4->pageSize;
              iVar8 = eMode;
            }
            iVar7 = sqlite3WalCheckpoint
                              (pWal,db_00,iVar8,xBusy,pBusyArg,(uint)bVar2,iVar7,
                               (u8 *)pPVar4->pTmpSpace,pnLog,pnCkpt);
          }
        }
        if (p->sharable != '\0') {
          piVar1 = &p->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(p);
          }
        }
      }
      iVar8 = iVar7;
      if (iVar7 == 5) {
        iVar8 = 0;
      }
      if (iVar7 == 5) {
        bVar6 = true;
      }
      iVar7 = db->nDb;
      pnLog = (int *)0x0;
      pnCkpt = (int *)0x0;
    }
    else {
      iVar8 = 0;
    }
    if (iVar8 != 0) break;
    lVar9 = lVar9 + 0x20;
    bVar5 = lVar10 < iVar7;
    lVar10 = lVar10 + 1;
  } while (bVar5);
  iVar7 = 5;
  if (!bVar6) {
    iVar7 = iVar8;
  }
  if (iVar8 != 0) {
    iVar7 = iVar8;
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );
  testcase( iDb==SQLITE_MAX_ATTACHED ); /* See forum post a006d86f72 */
  testcase( iDb==SQLITE_MAX_DB );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_DB ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}